

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O2

void __thiscall KDReports::Test::fontScalerShouldScaleForHeight(Test *this)

{
  char cVar1;
  char16_t *pcVar2;
  double dVar3;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QFontMetricsF local_60 [8];
  double local_58;
  QFont f;
  FontScaler scaler;
  char16_t *local_30;
  QFontMetricsF local_28 [16];
  double local_18;
  
  if (fontFound) {
    QString::QString((QString *)&scaler,"Noto Sans");
    QFont::QFont(&f,(QString *)&scaler,-1,-1,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&scaler);
    QFont::setPixelSize((int)&f);
    KDReports::FontScaler::FontScaler(&scaler,&f);
    KDReports::FontScaler::setFactorForHeight(50.0);
    local_58 = local_18;
    if (local_18 <= 0.42) {
      QString::number(local_18,(char)&local_78,0x67);
      QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
      pcVar2 = local_90.ptr;
      if (local_90.ptr == (char16_t *)0x0) {
        pcVar2 = (char16_t *)&QByteArray::_empty;
      }
      cVar1 = QTest::qVerify(false,"factor > 0.42",(char *)pcVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x77);
    }
    else {
      QString::number(local_18,(char)&local_78,0x67);
      QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
      pcVar2 = local_90.ptr;
      if (local_90.ptr == (char16_t *)0x0) {
        pcVar2 = (char16_t *)&QByteArray::_empty;
      }
      cVar1 = QTest::qVerify(true,"factor > 0.42",(char *)pcVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x77);
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    if (cVar1 != '\0') {
      if (0.49 <= local_58) {
        QString::number(local_58,(char)&local_78,0x67);
        QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
        pcVar2 = local_90.ptr;
        if (local_90.ptr == (char16_t *)0x0) {
          pcVar2 = (char16_t *)&QByteArray::_empty;
        }
        cVar1 = QTest::qVerify(false,"factor < 0.49",(char *)pcVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x78);
      }
      else {
        QString::number(local_58,(char)&local_78,0x67);
        QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
        pcVar2 = local_90.ptr;
        if (local_90.ptr == (char16_t *)0x0) {
          pcVar2 = (char16_t *)&QByteArray::_empty;
        }
        cVar1 = QTest::qVerify(true,"factor < 0.49",(char *)pcVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x78);
      }
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      if (cVar1 != '\0') {
        QFontMetricsF::QFontMetricsF((QFontMetricsF *)&local_90,local_28);
        local_58 = (double)QFontMetricsF::height();
        QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&local_90);
        if (local_58 <= 50.0) {
          QString::number(local_58,(char)&local_78,0x67);
          QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
          pcVar2 = local_90.ptr;
          if (local_90.ptr == (char16_t *)0x0) {
            pcVar2 = (char16_t *)&QByteArray::_empty;
          }
          cVar1 = QTest::qVerify(true,"scaledHeight <= wantedHeight",(char *)pcVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                 ,0x7c);
        }
        else {
          QString::number(local_58,(char)&local_78,0x67);
          QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
          pcVar2 = local_90.ptr;
          if (local_90.ptr == (char16_t *)0x0) {
            pcVar2 = (char16_t *)&QByteArray::_empty;
          }
          cVar1 = QTest::qVerify(false,"scaledHeight <= wantedHeight",(char *)pcVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                 ,0x7c);
        }
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        if (cVar1 != '\0') {
          if (local_58 <= 44.0) {
            QString::number(local_58,(char)&local_78,0x67);
            QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
            pcVar2 = local_90.ptr;
            if (local_90.ptr == (char16_t *)0x0) {
              pcVar2 = (char16_t *)&QByteArray::_empty;
            }
            cVar1 = QTest::qVerify(false,"scaledHeight > wantedHeight - 6",(char *)pcVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0x7d);
          }
          else {
            QString::number(local_58,(char)&local_78,0x67);
            QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
            pcVar2 = local_90.ptr;
            if (local_90.ptr == (char16_t *)0x0) {
              pcVar2 = (char16_t *)&QByteArray::_empty;
            }
            cVar1 = QTest::qVerify(true,"scaledHeight > wantedHeight - 6",(char *)pcVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0x7d);
          }
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          if (cVar1 != '\0') {
            KDReports::FontScaler::setFactorForHeight(2.9);
            QFontMetricsF::QFontMetricsF((QFontMetricsF *)&local_90,local_28);
            local_58 = (double)QFontMetricsF::height();
            QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&local_90);
            if (local_58 <= 4.0) {
              QFontMetricsF::QFontMetricsF(local_60,local_28);
              dVar3 = (double)QFontMetricsF::height();
              QString::number(dVar3,(char)&local_78,0x67);
              QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
              if (local_90.ptr == (char16_t *)0x0) {
                local_90.ptr = (char16_t *)&QByteArray::_empty;
              }
              QTest::qVerify(true,"scaler.fontMetrics().height() <= 4",(char *)local_90.ptr,
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x86);
            }
            else {
              QFontMetricsF::QFontMetricsF(local_60,local_28);
              dVar3 = (double)QFontMetricsF::height();
              QString::number(dVar3,(char)&local_78,0x67);
              QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_78);
              if (local_90.ptr == (char16_t *)0x0) {
                local_90.ptr = (char16_t *)&QByteArray::_empty;
              }
              QTest::qVerify(false,"scaler.fontMetrics().height() <= 4",(char *)local_90.ptr,
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x86);
            }
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            QFontMetricsF::~QFontMetricsF(local_60);
          }
        }
      }
    }
    FontScaler::~FontScaler(&scaler);
    QFont::~QFont(&f);
  }
  else {
    QString::QString((QString *)&local_78,"Font %1 not found");
    QString::QString((QString *)&f,"Noto Sans");
    QString::arg((QString *)&local_90,(int)&local_78,(QChar)(char16_t)&f);
    QString::toLatin1_helper_inplace((QString *)&scaler);
    if (local_30 == (char16_t *)0x0) {
      local_30 = (char16_t *)&QByteArray::_empty;
    }
    QTest::qSkip((char *)local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0x6e);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&scaler);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&f);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  return;
}

Assistant:

void fontScalerShouldScaleForHeight()
    {
#ifndef Q_OS_MAC // disabled on Mac due to a different DPI value. The code should be portable anyway :)
        SKIP_IF_FONT_NOT_FOUND

        QFont f(s_fontName);
        f.setPixelSize(86);
        FontScaler scaler(f);

        const qreal wantedHeight = 50;
        scaler.setFactorForHeight(wantedHeight);
        const qreal factor = scaler.scalingFactor();
        QVERIFY2(factor > 0.42, qPrintable(QString::number(factor)));
        QVERIFY2(factor < 0.49, qPrintable(QString::number(factor)));

        {
            const qreal scaledHeight = scaler.fontMetrics().height();
            QVERIFY2(scaledHeight <= wantedHeight, qPrintable(QString::number(scaledHeight)));
            QVERIFY2(scaledHeight > wantedHeight - 6, qPrintable(QString::number(scaledHeight)));
        }

#ifndef Q_OS_WIN
        // Testing a really small wanted height
        // Seems that on linux we can't go down to 2.7, the min is 3.0
        // Maybe because ascent=1, descent=1, height=1+1+1=3. Well, sometimes 4.
        // On Windows we can get 2, though.
        scaler.setFactorForHeight(2.9);
        QVERIFY2(scaler.fontMetrics().height() <= 4, qPrintable(QString::number(scaler.fontMetrics().height())));
#endif
#endif
    }